

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNsPtr xmlDOMWrapNSNormDeclareNsForced
                   (xmlDocPtr doc,xmlNodePtr elem,xmlChar *nsName,xmlChar *prefix,int checkShadow)

{
  int iVar1;
  xmlNsPtr pxVar2;
  _xmlNs *p_Var3;
  _xmlDoc *p_Var4;
  xmlChar *str1;
  xmlNsPtr ns;
  _xmlNs *p_Var5;
  xmlNs *pxVar6;
  uint uVar7;
  char buf [50];
  xmlChar local_68 [56];
  
  if (doc->type == XML_ELEMENT_NODE) {
    uVar7 = 0;
    str1 = nsName;
LAB_001510e4:
    for (p_Var5 = doc->oldNs; p_Var5 != (_xmlNs *)0x0; p_Var5 = p_Var5->next) {
      if ((p_Var5->prefix == str1) || (iVar1 = xmlStrEqual(str1,p_Var5->prefix), iVar1 != 0))
      goto LAB_001511ac;
    }
    if (((((int)prefix == 0) || (p_Var4 = (_xmlDoc *)doc->parent, p_Var4 == (_xmlDoc *)0x0)) ||
        (p_Var4->doc == p_Var4)) || (p_Var4->type == XML_NAMESPACE_DECL)) {
LAB_001511fd:
      pxVar2 = xmlNewNs((xmlNodePtr)0x0,(xmlChar *)elem,str1);
      if (pxVar2 != (xmlNsPtr)0x0) {
        p_Var5 = doc->oldNs;
        if (doc->oldNs == (_xmlNs *)0x0) {
          p_Var3 = (_xmlNs *)&doc->oldNs;
        }
        else {
          do {
            p_Var3 = p_Var5;
            p_Var5 = p_Var3->next;
          } while (p_Var3->next != (_xmlNs *)0x0);
        }
        p_Var3->next = pxVar2;
        return pxVar2;
      }
      return (xmlNsPtr)0x0;
    }
    if (((str1 == (xmlChar *)0x0) || (*str1 != 'x')) ||
       ((str1[1] != 'm' || ((str1[2] != 'l' || (str1[3] != '\0')))))) {
      do {
        if (((_xmlNode *)p_Var4)->type == XML_ELEMENT_NODE) {
          for (pxVar6 = ((_xmlNode *)p_Var4)->nsDef; pxVar6 != (xmlNs *)0x0; pxVar6 = pxVar6->next)
          {
            if ((pxVar6->prefix == str1) || (iVar1 = xmlStrEqual(str1,pxVar6->prefix), iVar1 != 0))
            {
              if (pxVar6->href == (xmlChar *)0x0) goto LAB_001511fd;
              goto LAB_001511ac;
            }
          }
        }
        else if (((_xmlNode *)p_Var4)->type == XML_ENTITY_DECL) goto LAB_001511fd;
        p_Var4 = (_xmlDoc *)((_xmlNode *)p_Var4)->parent;
        if ((p_Var4 == (_xmlDoc *)0x0) || (p_Var4->doc == p_Var4)) goto LAB_001511fd;
      } while( true );
    }
LAB_001511ac:
    if (uVar7 != 1000) {
      uVar7 = uVar7 + 1;
      str1 = local_68;
      if (nsName == (xmlChar *)0x0) {
        snprintf((char *)str1,0x32,"ns_%d",(ulong)uVar7);
      }
      else {
        snprintf((char *)str1,0x32,"%.30s_%d",nsName,(ulong)uVar7);
      }
      goto LAB_001510e4;
    }
  }
  return (xmlNsPtr)0x0;
}

Assistant:

static xmlNsPtr
xmlDOMWrapNSNormDeclareNsForced(xmlDocPtr doc,
				xmlNodePtr elem,
				const xmlChar *nsName,
				const xmlChar *prefix,
				int checkShadow)
{

    xmlNsPtr ret;
    char buf[50];
    const xmlChar *pref;
    int counter = 0;

    if ((doc == NULL) || (elem == NULL) || (elem->type != XML_ELEMENT_NODE))
        return(NULL);
    /*
    * Create a ns-decl on @anchor.
    */
    pref = prefix;
    while (1) {
	/*
	* Lookup whether the prefix is unused in elem's ns-decls.
	*/
	if ((elem->nsDef != NULL) &&
	    (xmlTreeNSListLookupByPrefix(elem->nsDef, pref) != NULL))
	    goto ns_next_prefix;
	if (checkShadow && elem->parent &&
	    ((xmlNodePtr) elem->parent->doc != elem->parent)) {
	    /*
	    * Does it shadow ancestor ns-decls?
	    */
	    if (xmlSearchNsByPrefixStrict(doc, elem->parent, pref, NULL) == 1)
		goto ns_next_prefix;
	}
	ret = xmlNewNs(NULL, nsName, pref);
	if (ret == NULL)
	    return (NULL);
	if (elem->nsDef == NULL)
	    elem->nsDef = ret;
	else {
	    xmlNsPtr ns2 = elem->nsDef;
	    while (ns2->next != NULL)
		ns2 = ns2->next;
	    ns2->next = ret;
	}
	return (ret);
ns_next_prefix:
	counter++;
	if (counter > 1000)
	    return (NULL);
	if (prefix == NULL) {
	    snprintf((char *) buf, sizeof(buf),
		"ns_%d", counter);
	} else
	    snprintf((char *) buf, sizeof(buf),
	    "%.30s_%d", (char *)prefix, counter);
	pref = BAD_CAST buf;
    }
}